

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::FBXImporter::CanRead(FBXImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  char *tokens [1];
  char *local_70;
  size_t local_68;
  char local_60 [16];
  string local_50;
  
  BaseImporter::GetExtension(&local_50,pFile);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fbx","");
  if (local_50._M_string_length == local_68) {
    if (local_50._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_50._M_dataplus._M_p,local_70,local_50._M_string_length);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  bVar1 = true;
  if (bVar3) goto LAB_0016943e;
  if (local_50._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_00169413;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_00169413:
    local_70 = "fbx";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_70,1,200,false,false);
    goto LAB_0016943e;
  }
  bVar1 = false;
LAB_0016943e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool FBXImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == std::string( desc.mFileExtensions ) ) {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        // at least ASCII-FBX files usually have a 'FBX' somewhere in their head
        const char* tokens[] = {"fbx"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}